

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

int ON_UuidPtr::ComparePtr(ON_UuidPtr *a,ON_UuidPtr *b)

{
  int iVar1;
  
  if (a == (ON_UuidPtr *)0x0) {
    return -(uint)(b != (ON_UuidPtr *)0x0);
  }
  if (b == (ON_UuidPtr *)0x0) {
    iVar1 = 1;
  }
  else {
    if (b->m_ptr <= a->m_ptr) {
      return (int)(b->m_ptr < a->m_ptr);
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_UuidPtr::ComparePtr( const ON_UuidPtr* a, const ON_UuidPtr* b )
{
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;
  if (a->m_ptr < b->m_ptr)
    return -1;
  if (a->m_ptr > b->m_ptr)
    return 1;
  return 0;
}